

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor2008.h
# Opt level: O3

uint32_t __thiscall
FastPForLib::PFor2008::compressblockPFOR
          (PFor2008 *this,DATATYPE *in,uint32_t *outputbegin,uint32_t b,DATATYPE **exceptions)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  long lVar6;
  ulong uVar7;
  uint *puVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  pointer puVar12;
  ulong uVar13;
  
  if (b == 0x20) {
    memcpy(outputbegin,in,0x200);
  }
  else {
    uVar13 = 0;
    uVar9 = 1 << (b & 0x1f);
    puVar12 = (this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      puVar12[uVar13] = (uint)lVar6;
      uVar13 = (uVar13 + 1) - (ulong)(in[lVar6] < uVar9);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x80);
    if (uVar13 != 0) {
      pvVar1 = &this->codedcopy;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)pvVar1,in,in + 0x80);
      uVar2 = *(this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = (ulong)uVar2;
      uVar3 = (this->codedcopy).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10];
      puVar5 = *exceptions;
      puVar8 = puVar5 + 1;
      *exceptions = puVar8;
      *puVar5 = uVar3;
      if (b < 7) {
        if (uVar13 == 1) {
          puVar12 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        }
        else {
          puVar12 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar7 = 1;
          do {
            uVar11 = (uint)uVar10;
            uVar3 = (this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar7];
            puVar5 = puVar8;
            while (uVar11 + uVar9 < uVar3) {
              uVar11 = uVar9 + (int)uVar10;
              uVar4 = puVar12[uVar11];
              *exceptions = puVar5 + 1;
              *puVar5 = uVar4;
              puVar12 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              puVar12[uVar10] = uVar9 - 1;
              puVar5 = puVar5 + 1;
              uVar10 = (ulong)uVar11;
            }
            uVar4 = puVar12[uVar3];
            puVar8 = puVar5 + 1;
            uVar7 = uVar7 + 1;
            *exceptions = puVar8;
            *puVar5 = uVar4;
            puVar12 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar12[uVar10] = ~uVar11 + uVar3;
            uVar10 = (ulong)uVar3;
          } while (uVar7 != uVar13);
        }
      }
      else {
        puVar12 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (uVar13 != 1) {
          puVar5 = puVar5 + 2;
          uVar7 = 1;
          uVar9 = 2;
          do {
            uVar3 = (this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar7];
            uVar11 = puVar12[uVar3];
            *exceptions = puVar5;
            puVar5[-1] = uVar11;
            puVar5 = puVar5 + 1;
            puVar12 = (this->codedcopy).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar12[uVar10] = ~(uint)uVar10 + uVar3;
            uVar7 = (ulong)uVar9;
            uVar9 = uVar9 + 1;
            uVar10 = (ulong)uVar3;
          } while (uVar7 < uVar13);
        }
      }
      lVar6 = 0;
      do {
        fastpack((uint32_t *)((long)puVar12 + lVar6),outputbegin,b);
        lVar6 = lVar6 + 0x80;
        outputbegin = outputbegin + b;
      } while (lVar6 != 0x200);
      return uVar2;
    }
    lVar6 = 0;
    do {
      fastpack((uint32_t *)((long)in + lVar6),outputbegin,b);
      lVar6 = lVar6 + 0x80;
      outputbegin = outputbegin + b;
    } while (lVar6 != 0x200);
  }
  return 0x80;
}

Assistant:

uint32_t compressblockPFOR(const DATATYPE *__restrict__ in,
                             uint32_t *__restrict__ outputbegin,
                             const uint32_t b,
                             DATATYPE *__restrict__ &exceptions) {
    if (b == 32) {
      for (size_t k = 0; k < BlockSize; ++k)
        *(outputbegin++) = *(in++);
      return BlockSize;
    }
    size_t exceptcounter = 0;
    const uint32_t maxgap = 1U << b;
    {
      std::vector<uint32_t>::iterator cci = codedcopy.begin();
      for (uint32_t k = 0; k < BlockSize; ++k, ++cci) {
        miss[exceptcounter] = k;
        exceptcounter += (in[k] >= maxgap);
      }
    }
    if (exceptcounter == 0) {
      packblock(in, outputbegin, b);
      return BlockSize;
    }
    codedcopy.assign(in, in + BlockSize);
    uint32_t firstexcept = miss[0];
    uint32_t prev = 0;
    *(exceptions++) = codedcopy[firstexcept];
    prev = firstexcept;
    if (maxgap < BlockSize) {
      for (size_t i = 1; i < exceptcounter; ++i) {
        uint32_t cur = miss[i];
        // they don't include this part, but it is required:
        while (cur > maxgap + prev) {
          // compulsory exception
          uint32_t compulcur = prev + maxgap;
          *(exceptions++) = codedcopy[compulcur];
          codedcopy[prev] = maxgap - 1;
          prev = compulcur;
        }
        *(exceptions++) = codedcopy[cur];
        codedcopy[prev] = cur - prev - 1;
        prev = cur;
      }
    } else {
      for (uint32_t i = 1; i < exceptcounter; ++i) {
        uint32_t cur = miss[i];
        *(exceptions++) = codedcopy[cur];
        codedcopy[prev] = cur - prev - 1;
        prev = cur;
      }
    }
    packblock(&codedcopy[0], outputbegin, b);
    return firstexcept;
  }